

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::WriteLine
                    (Variant *__return_storage_ptr__,ScriptPtr param_1,Parameters *params)

{
  Variant *var;
  
  var = (Variant *)
        (param_1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _M_pi)->_vptr__Sp_counted_base;
  if (var != *(Variant **)
              &(param_1.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._M_pi)->_M_use_count) {
    DebugWriteInternal(Info,var);
  }
  LogWrite(Info,"\n");
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant WriteLine(ScriptPtr, const Parameters & params)
	{
		if (!params.empty())
			DebugWriteInternal(LogLevel::Info, params[0]);
		LogWrite(LogLevel::Info, "\n");
		return nullptr;
	}